

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test2::verifyResults(GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference pvVar5;
  TestContext *pTVar6;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  MessageBuilder local_378;
  int local_1f8;
  uint local_1f4;
  GLint value_1;
  GLuint i;
  GLint *feedback_data;
  undefined1 local_1e0 [3];
  bool result;
  int local_5c;
  uint local_58;
  GLint value;
  GLuint offset;
  GLuint x;
  GLuint y;
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> image_data;
  Functions *gl;
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  if ((shader_stage == FRAGMENT_SHADER) || (shader_stage == COMPUTE_SHADER)) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)local_40,0x400);
    (**(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x2e))(0xde1,this->m_texture_id);
    dVar3 = (**(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar3,"BindTexture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11c4);
    pcVar1 = *(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 0x2a8);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_40,0);
    (*pcVar1)(0xde1,0,0x8d94,0x1404,pvVar5);
    dVar3 = (**(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar3,"GetTexImage",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11c7);
    for (offset = 0; offset < 0x20; offset = offset + 1) {
      for (value = 0; (uint)value < 0x20; value = value + 1) {
        local_58 = offset * 0x20 + value;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_40,(ulong)local_58);
        local_5c = *pvVar5;
        if (local_5c != 1) {
          pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
          pTVar7 = tcu::TestContext::getLog(pTVar6);
          tcu::TestLog::operator<<
                    ((MessageBuilder *)local_1e0,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message)
          ;
          pMVar8 = tcu::MessageBuilder::operator<<
                             ((MessageBuilder *)local_1e0,
                              (char (*) [39])"Error. Texture contents are wrong at (");
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(uint *)&value);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&offset);
          pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2a94734);
          tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1e0);
          this_local._7_1_ = false;
          goto LAB_00f97eb4;
        }
      }
    }
    this_local._7_1_ = true;
LAB_00f97eb4:
    feedback_data._4_4_ = 1;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  }
  else {
    feedback_data._3_1_ = 1;
    (**(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x10))
              (0x8c8e,this->m_transform_feedback_buffer_id);
    dVar3 = (**(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar3,"BindBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11e5);
    _value_1 = (**(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + 0x33e))(0x8c8e,35000);
    dVar3 = (**(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar3,"MapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11e8);
    for (local_1f4 = 0; local_1f4 < 0x400; local_1f4 = local_1f4 + 1) {
      local_1f8 = *(int *)(_value_1 + (ulong)local_1f4 * 4);
      if (local_1f8 != 1) {
        pTVar6 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar7 = tcu::TestContext::getLog(pTVar6);
        tcu::TestLog::operator<<(&local_378,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<
                           (&local_378,
                            (char (*) [56])"Error. Transform feedback buffer contents are wrong at "
                           );
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_1f4);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_378);
        feedback_data._3_1_ = 0;
        break;
      }
    }
    (**(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 0x59c))(0x8c8e);
    dVar3 = (**(code **)(image_data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 0x200))();
    glu::checkError(dVar3,"UnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x11fb);
    this_local._7_1_ = (bool)(feedback_data._3_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool GPUShaderFP64Test2::verifyResults(shaderStage shader_stage) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if ((FRAGMENT_SHADER == shader_stage) || (COMPUTE_SHADER == shader_stage))
	{
		/* Verify contents of texture */

		/* Prepare storage for testure data */
		std::vector<glw::GLint> image_data;
		image_data.resize(m_texture_width * m_texture_height);

		/* Get texture contents */
		gl.bindTexture(GL_TEXTURE_2D, m_texture_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

		gl.getTexImage(GL_TEXTURE_2D, 0 /* level */, GL_RED_INTEGER, GL_INT, &image_data[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetTexImage");

		for (glw::GLuint y = 0; y < m_texture_width; ++y)
		{
			for (glw::GLuint x = 0; x < m_texture_height; ++x)
			{
				const glw::GLuint offset = y * m_texture_width + x;
				const glw::GLint  value  = image_data[offset];

				if (m_result_success != value)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Error. Texture contents are wrong at (" << x << ", " << y << ")"
						<< tcu::TestLog::EndMessage;

					return false;
				}
			}
		}

		return true;
	}
	else
	{
		/* Verify contents of transform feedback buffer */

		bool result = true;

		/* Get transform feedback data */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_transform_feedback_buffer_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindBuffer");

		glw::GLint* feedback_data = (glw::GLint*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MapBuffer");

		for (glw::GLuint i = 0; i < m_n_captured_results; ++i)
		{
			const glw::GLint value = feedback_data[i];

			if (m_result_success != value)
			{
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "Error. Transform feedback buffer contents are wrong at " << i
													<< tcu::TestLog::EndMessage;

				result = false;
				break;
			}
		}

		/* Unmap transform feedback buffer */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

		return result;
	}
}